

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.h
# Opt level: O0

void __thiscall
wallet::PreSelectedInputs::Insert(PreSelectedInputs *this,COutput *output,bool subtract_fee_outputs)

{
  CAmount CVar1;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>,_bool> pVar2;
  shared_ptr<wallet::COutput> *in_stack_ffffffffffffff88;
  value_type *__x;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  COutput *in_stack_ffffffffffffffb8;
  value_type local_28;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_DL & 1) == 0) {
    CVar1 = COutput::GetEffectiveValue
                      ((COutput *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    *(CAmount *)(in_RDI + 0x30) = CVar1 + *(long *)(in_RDI + 0x30);
  }
  else {
    *(long *)(in_RDI + 0x30) = *(long *)(in_RSI + 0x48) + *(long *)(in_RDI + 0x30);
  }
  __x = &local_28;
  std::make_shared<wallet::COutput,wallet::COutput_const&>(in_stack_ffffffffffffffb8);
  pVar2 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::insert((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),__x);
  local_18 = (_Base_ptr)pVar2.first._M_node;
  local_10 = pVar2.second;
  _GLOBAL__N_1::std::shared_ptr<wallet::COutput>::~shared_ptr(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Insert(const COutput& output, bool subtract_fee_outputs)
    {
        if (subtract_fee_outputs) {
            total_amount += output.txout.nValue;
        } else {
            total_amount += output.GetEffectiveValue();
        }
        coins.insert(std::make_shared<COutput>(output));
    }